

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::is_hidden_variable(Compiler *this,SPIRVariable *var,bool include_builtins)

{
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  __node_base_ptr p_Var5;
  CombinedImageSampler *pCVar6;
  size_t sVar7;
  CombinedImageSampler *pCVar8;
  long lVar9;
  long lVar10;
  key_type local_1c;
  
  bVar3 = is_builtin_variable(this,var);
  if (bVar3 && !include_builtins) {
    return true;
  }
  if (var->remapped_variable != false) {
    return true;
  }
  pCVar1 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  uVar4 = (var->super_IVariant).self.id;
  lVar9 = (long)sVar2 >> 2;
  pCVar6 = pCVar1;
  sVar7 = sVar2;
  if (0 < lVar9) {
    pCVar6 = pCVar1 + lVar9 * 4;
    lVar10 = lVar9 + 1;
    pCVar8 = pCVar1 + 2;
    do {
      if (pCVar8[-2].combined_id.id == uVar4) {
        pCVar8 = pCVar8 + -2;
        goto LAB_00381c86;
      }
      if (pCVar8[-1].combined_id.id == uVar4) {
        pCVar8 = pCVar8 + -1;
        goto LAB_00381c86;
      }
      if ((pCVar8->combined_id).id == uVar4) goto LAB_00381c86;
      if (pCVar8[1].combined_id.id == uVar4) {
        pCVar8 = pCVar8 + 1;
        goto LAB_00381c86;
      }
      lVar10 = lVar10 + -1;
      pCVar8 = pCVar8 + 4;
    } while (1 < lVar10);
    sVar7 = ((long)(sVar2 * 0xc + lVar9 * -0x30) >> 2) * -0x5555555555555555;
  }
  if (sVar7 == 1) {
LAB_00381c7f:
    pCVar8 = pCVar6;
    if ((pCVar6->combined_id).id != uVar4) goto LAB_00381c92;
  }
  else if (sVar7 == 2) {
LAB_00381c60:
    pCVar8 = pCVar6;
    if ((pCVar6->combined_id).id != uVar4) {
      pCVar6 = pCVar6 + 1;
      goto LAB_00381c7f;
    }
  }
  else {
    if (sVar7 != 3) goto LAB_00381c92;
    pCVar8 = pCVar6;
    if ((pCVar6->combined_id).id != uVar4) {
      pCVar6 = pCVar6 + 1;
      goto LAB_00381c60;
    }
  }
LAB_00381c86:
  if (pCVar8 != pCVar1 + sVar2) {
    return false;
  }
LAB_00381c92:
  uVar4 = ParsedIR::get_spirv_version(&this->ir);
  if (((0x103ff < uVar4) && (1 < var->storage - Function)) &&
     (bVar3 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id), !bVar3))
  {
    return true;
  }
  if (this->check_active_interface_variables != true) {
    return false;
  }
  if (var->storage < (StorageBuffer|Input)) {
    if ((0x160fU >> (var->storage & 0x1f) & 1) == 0) {
      return false;
    }
    local_1c.id = (var->super_IVariant).self.id;
    p_Var5 = ::std::
             _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_before_node
                       (&(this->active_interface_variables)._M_h,
                        (ulong)local_1c.id % (this->active_interface_variables)._M_h._M_bucket_count
                        ,&local_1c,(ulong)local_1c.id);
    if (p_Var5 == (__node_base_ptr)0x0) {
      return true;
    }
    return p_Var5->_M_nxt == (_Hash_node_base *)0x0;
  }
  return false;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	// In SPIR-V 1.4 and up we must also use the active variable interface to disable global variables
	// which are not part of the entry point.
	if (ir.get_spirv_version() >= 0x10400 && var.storage != spv::StorageClassGeneric &&
	    var.storage != spv::StorageClassFunction && !interface_variable_exists_in_entry_point(var.self))
	{
		return true;
	}

	return check_active_interface_variables && storage_class_is_interface(var.storage) &&
	       active_interface_variables.find(var.self) == end(active_interface_variables);
}